

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointSendStringAt
               (HelicsEndpoint endpoint,char *message,HelicsTime time,HelicsError *err)

{
  long in_RSI;
  EndpointObject *endObj;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  data_view *this;
  HelicsEndpoint in_stack_ffffffffffffff88;
  data_view *in_stack_ffffffffffffff90;
  Endpoint *in_stack_ffffffffffffff98;
  Time in_stack_ffffffffffffffa0;
  data_view local_48;
  EndpointObject *local_28;
  long local_10;
  
  local_10 = in_RSI;
  local_28 = anon_unknown.dwarf_784a3::verifyEndpoint
                       (in_stack_ffffffffffffff88,(HelicsError *)in_stack_ffffffffffffff80);
  if (local_28 != (EndpointObject *)0x0) {
    if (local_10 == 0) {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff80);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&in_stack_ffffffffffffff90->dblock,(char *)local_28->endPtr);
    }
    this = &local_48;
    helics::data_view::data_view<std::basic_string_view<char,std::char_traits<char>>,void>
              (this,in_stack_ffffffffffffff78);
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)this,(double)in_stack_ffffffffffffff78);
    helics::Endpoint::sendAt
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffffa0);
    helics::data_view::~data_view((data_view *)0x1de563);
  }
  return;
}

Assistant:

void helicsEndpointSendStringAt(HelicsEndpoint endpoint, const char* message, HelicsTime time, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->sendAt(AS_STRING_VIEW(message), time);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}